

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.cpp
# Opt level: O1

bool Format::FromSize(int64_t size,Format *fmt)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  
  if (size < 0x134000) {
    if (size < 0x5a000) {
      if (size < 0x2d000) {
        if (size == 0x23000) {
          fmt->cyls = 0x23;
          fmt->heads = 1;
          fmt->fdc = Apple;
          fmt->datarate = _250K;
          fmt->encoding = Apple;
          fmt->sectors = 0x10;
          fmt->size = 1;
          fmt->base = 0;
          fmt->offset = 0;
          fmt->interleave = 1;
          fmt->skew = 0;
          fmt->head0 = 0;
          fmt->head1 = 1;
          fmt->gap3 = 0;
LAB_0015e664:
          fmt->fill = '\0';
          fmt->cyls_first = false;
          return true;
        }
        if (size != 0x28000) {
          return false;
        }
        fmt->cyls = 0x28;
        iVar2 = 8;
LAB_0015e5f9:
        fmt->datarate = _250K;
        fmt->encoding = MFM;
        fmt->sectors = iVar2;
        fmt->size = 2;
        fmt->base = 1;
        fmt->offset = 0;
        fmt->interleave = 1;
        fmt->skew = 1;
        fmt->head0 = 0;
        fmt->head1 = 1;
        fmt->gap3 = 0x50;
        fmt->fill = 0xf6;
        fmt->cyls_first = false;
        fmt->heads = 1;
        fmt->fdc = PC;
        return true;
      }
      if (size == 0x2d000) {
        fmt->cyls = 0x28;
        iVar2 = 9;
        goto LAB_0015e5f9;
      }
      if (size != 0x50000) {
        return false;
      }
      fmt->cyls = 0x28;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _250K;
      iVar2 = 8;
    }
    else {
      if (size < 0xb4000) {
        if (size != 0x5a000) {
          if (size == 0xa0000) {
            fmt->cyls = 0x50;
            fmt->heads = 2;
            fmt->fdc = PC;
            fmt->datarate = _250K;
            fmt->encoding = MFM;
            fmt->sectors = 8;
            fmt->size = 2;
            fmt->base = 1;
            fmt->offset = 0;
            fmt->interleave = 1;
            fmt->skew = 1;
            fmt->head0 = 0;
            fmt->head1 = 1;
            fmt->gap3 = 0x50;
            fmt->fill = 0xe5;
            fmt->cyls_first = false;
            return true;
          }
          return false;
        }
        iVar2 = 0x28;
      }
      else {
        if (size != 0xb4000) {
          if (size == 0xc8000) {
            fmt->cyls = 0x50;
            fmt->heads = 2;
            fmt->fdc = WD;
            fmt->datarate = _250K;
            fmt->encoding = MFM;
            fmt->sectors = 10;
            fmt->size = 2;
            fmt->base = 1;
            fmt->offset = 0;
            fmt->interleave = 1;
            fmt->skew = 1;
            fmt->head0 = 0;
            fmt->head1 = 1;
            fmt->gap3 = 0x18;
            goto LAB_0015e664;
          }
          if ((char *)size !=
              "e_stringIJ7CylHeadRA9_KcRKiRA11_S2_EEENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEDpOT_"
             ) {
            return false;
          }
          fmt->cyls = 0x50;
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          iVar2 = 0xf;
          iVar3 = 2;
          goto LAB_0015e7a7;
        }
        iVar2 = 0x50;
      }
      fmt->cyls = iVar2;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _250K;
      iVar2 = 9;
    }
    fmt->encoding = MFM;
    fmt->sectors = iVar2;
    fmt->size = 2;
    fmt->base = 1;
    fmt->offset = 0;
    fmt->interleave = 1;
    fmt->skew = 1;
    fmt->head0 = 0;
    uVar1 = 0x5000000001;
LAB_0015e7c0:
    fmt->head1 = (int)uVar1;
    fmt->gap3 = (int)((ulong)uVar1 >> 0x20);
    fmt->fill = 0xf6;
    fmt->cyls_first = false;
  }
  else {
    if (size < 0x1b3c00) {
      if (size < 0x190000) {
        if (size == 0x134000) {
          fmt->cyls = 0x4d;
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          iVar2 = 8;
          iVar3 = 3;
LAB_0015e7a7:
          fmt->encoding = MFM;
          fmt->sectors = iVar2;
          fmt->size = iVar3;
          fmt->base = 1;
          fmt->offset = 0;
          fmt->interleave = 1;
          fmt->skew = 1;
          fmt->head0 = 0;
          uVar1 = 0x5400000001;
        }
        else {
          if ((undefined1 *)size != &LAB_00168000) {
            return false;
          }
          fmt->cyls = 0x50;
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          fmt->encoding = MFM;
          fmt->sectors = 0x12;
          fmt->size = 2;
          fmt->base = 1;
          fmt->offset = 0;
          fmt->interleave = 1;
          fmt->skew = 1;
          fmt->head0 = 0;
          uVar1 = 0x6500000001;
        }
        goto LAB_0015e7c0;
      }
      if (size == 0x190000) {
        fmt->cyls = 0x50;
        fmt->heads = 2;
        fmt->fdc = PC;
        fmt->datarate = _500K;
        fmt->encoding = MFM;
        fmt->base = 1;
        fmt->offset = 0;
        fmt->interleave = 1;
        fmt->skew = 1;
        fmt->head0 = 0;
        fmt->head1 = 1;
        fmt->fill = 0xf6;
        fmt->cyls_first = false;
        uVar1 = 0x200000014;
      }
      else {
        if (size == 0x1a4000) {
          fmt->cyls = 0x50;
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          fmt->encoding = MFM;
          fmt->base = 1;
          fmt->offset = 0;
          fmt->interleave = 1;
          fmt->skew = 1;
          fmt->head0 = 0;
          fmt->head1 = 1;
          fmt->fill = 0xf6;
          fmt->cyls_first = false;
        }
        else {
          if ((uint *)size != &switchD_0015db98::switchdataD_001ae800) {
            return false;
          }
          fmt->cyls = 0x50;
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          fmt->encoding = MFM;
          fmt->base = 1;
          fmt->offset = 0;
          fmt->interleave = 1;
          fmt->skew = 1;
          fmt->head0 = 0;
          fmt->head1 = 1;
          fmt->fill = 0xf6;
          fmt->cyls_first = false;
          fmt->cyls = 0x52;
        }
LAB_0015e802:
        uVar1 = 0x200000015;
      }
    }
    else if (size < 0x1cc000) {
      if ((char *)size == "adDiskSaIS0_ELN9__gnu_cxx12_Lock_policyE2EE") {
        fmt->cyls = 0x50;
        fmt->heads = 2;
        fmt->fdc = PC;
        fmt->datarate = _500K;
        fmt->encoding = MFM;
        fmt->base = 1;
        fmt->offset = 0;
        fmt->interleave = 1;
        fmt->skew = 1;
        fmt->head0 = 0;
        fmt->head1 = 1;
        fmt->fill = 0xf6;
        fmt->cyls_first = false;
        fmt->cyls = 0x53;
        goto LAB_0015e802;
      }
      if (size != 0x1b8000) {
        return false;
      }
      fmt->cyls = 0x50;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _500K;
      fmt->encoding = MFM;
      fmt->base = 1;
      fmt->offset = 0;
      fmt->interleave = 1;
      fmt->skew = 1;
      fmt->head0 = 0;
      fmt->head1 = 1;
      fmt->fill = 0xf6;
      fmt->cyls_first = false;
      uVar1 = 0x200000016;
    }
    else if (size == 0x1cc000) {
      fmt->cyls = 0x50;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _500K;
      fmt->encoding = MFM;
      fmt->base = 1;
      fmt->offset = 0;
      fmt->interleave = 1;
      fmt->skew = 1;
      fmt->head0 = 0;
      fmt->head1 = 1;
      fmt->fill = 0xf6;
      fmt->cyls_first = false;
      uVar1 = 0x200000017;
    }
    else {
      if (size != 0x1e0000) {
        if (size != 0x2d0000) {
          return false;
        }
        fmt->cyls = 0x50;
        fmt->heads = 2;
        fmt->fdc = PC;
        fmt->datarate = _1M;
        fmt->encoding = MFM;
        fmt->sectors = 0x24;
        fmt->size = 2;
        fmt->base = 1;
        fmt->offset = 0;
        fmt->interleave = 1;
        fmt->skew = 1;
        fmt->head0 = 0;
        uVar1 = 0x5300000001;
        goto LAB_0015e7c0;
      }
      fmt->cyls = 0x50;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _500K;
      fmt->encoding = MFM;
      fmt->base = 1;
      fmt->offset = 0;
      fmt->interleave = 1;
      fmt->skew = 1;
      fmt->head0 = 0;
      fmt->head1 = 1;
      fmt->fill = 0xf6;
      fmt->cyls_first = false;
      uVar1 = 0x200000018;
    }
    fmt->sectors = (int)uVar1;
    fmt->size = (int)((ulong)uVar1 >> 0x20);
    fmt->gap3 = 0;
  }
  return true;
}

Assistant:

bool Format::FromSize(int64_t size, Format& fmt)
{
    switch (size)
    {
    case 143360:    // Apple ][
        fmt = RegularFormat::DO;
        break;

    case 163840:    // 5.25" SSSD (160K)
        fmt = RegularFormat::PC320;
        fmt.heads = 1;
        break;

    case 184320:    // 5.25" SSSD (180K)
        fmt = RegularFormat::PC360;
        fmt.heads = 1;
        break;

    case 327680:    // 5.25" DSDD (320K)
        fmt = RegularFormat::PC320;
        break;

    case 368640:    // 5.25" DSDD (360K)
        fmt = RegularFormat::PC360;
        break;

    case 655360:    // 3.5"  DSDD (640K)
        fmt = RegularFormat::PC640;
        break;

    case 737280:    // 3.5"  DSDD (720K)
        fmt = RegularFormat::PC720;
        break;

    case 819200:    // MGT (800K), for legacy matching.
        fmt = RegularFormat::MGT;
        break;

    case 1228800:   // 5.25" DSHD (1200K)
        fmt = RegularFormat::PC1200;
        break;

    case 1261568:   // 5.25" DSHD (1232K)
        fmt = RegularFormat::PC1232;
        break;

    case 1474560:   // 3.5"  DSHD (1440K)
        fmt = RegularFormat::PC1440;
        break;

    case 1638400:   // 3.5"  DSHD (1600K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 20;
        fmt.gap3 = 0;
        break;

    case 1720320:   // 3.5"  DSHD (1680K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1763328:   // 3.5"  DSHD (1722K)
        fmt = RegularFormat::PC1440;
        fmt.cyls = 82;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1784832:   // 3.5"  DSHD (1743K)
        fmt = RegularFormat::PC1440;
        fmt.cyls = 83;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1802240:   // 3.5"  DSHD (1760K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 22;
        fmt.gap3 = 0;
        break;

    case 1884160:   // 3.5"  DSHD (1840K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 23;
        fmt.gap3 = 0;
        break;

    case 1966080:   // 3.5"  DSHD (1920K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 24;
        fmt.gap3 = 0;
        break;

    case 2949120:   // 3.5"  DSED (2880K)
        fmt = RegularFormat::PC2880;
        break;

    default:
        return false;
    }

    return true;
}